

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

bool __thiscall
tetgenmesh::lu_decmp(tetgenmesh *this,double (*lu) [4],int n,int *ps,double *d,int N)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  double *pdVar10;
  long lVar11;
  int *piVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  double dVar16;
  double dVar17;
  int local_78;
  double adStack_58 [5];
  double scales [4];
  
  *d = 1.0;
  iVar4 = N + n;
  if (0 < n) {
    lVar8 = (long)N;
    pdVar10 = (double *)((long)lu + lVar8 * 0x28);
    lVar11 = lVar8;
    do {
      pdVar6 = pdVar10;
      lVar14 = lVar8;
      dVar16 = 0.0;
      do {
        dVar17 = ABS(*pdVar6);
        if (ABS(*pdVar6) <= dVar16) {
          dVar17 = dVar16;
        }
        lVar14 = lVar14 + 1;
        pdVar6 = pdVar6 + 1;
        dVar16 = dVar17;
      } while (lVar14 < iVar4);
      if ((dVar17 == 0.0) && (!NAN(dVar17))) {
        adStack_58[(int)lVar11] = 0.0;
        return false;
      }
      adStack_58[lVar11] = 1.0 / dVar17;
      ps[lVar11] = (int)lVar11;
      lVar11 = lVar11 + 1;
      pdVar10 = pdVar10 + 4;
    } while (lVar11 < iVar4);
  }
  iVar7 = iVar4 + -1;
  if (N < iVar7) {
    piVar12 = ps + N;
    iVar9 = N + 1;
    iVar5 = n + -1;
    iVar15 = 0;
    lVar11 = (long)N;
    do {
      bVar3 = true;
      if (lVar11 < iVar4) {
        lVar8 = 0;
        dVar16 = 0.0;
        do {
          dVar17 = ABS(lu[piVar12[lVar8]][lVar11]) * adStack_58[piVar12[lVar8]];
          iVar1 = N + (int)lVar8;
          if (dVar17 <= dVar16) {
            dVar17 = dVar16;
            iVar1 = iVar15;
          }
          iVar15 = iVar1;
          lVar8 = lVar8 + 1;
          dVar16 = dVar17;
        } while (n != (int)lVar8);
        bVar3 = dVar17 == 0.0;
      }
      if (bVar3) {
        return false;
      }
      if (iVar15 != (int)lVar11) {
        iVar1 = ps[lVar11];
        ps[lVar11] = ps[iVar15];
        ps[iVar15] = iVar1;
        *d = -*d;
      }
      lVar8 = lVar11 + 1;
      local_78 = (int)lVar8;
      if (lVar8 < iVar4) {
        lVar14 = (long)local_78;
        iVar1 = ps[lVar11];
        dVar16 = lu[iVar1][lVar11];
        do {
          iVar2 = ps[lVar14];
          dVar17 = lu[iVar2][lVar11] / dVar16;
          lu[iVar2][lVar11] = dVar17;
          if ((dVar17 != 0.0) || (NAN(dVar17))) {
            lVar13 = 0;
            do {
              lu[iVar2][iVar9 + lVar13] =
                   lu[iVar1][iVar9 + lVar13] * -dVar17 + lu[iVar2][iVar9 + lVar13];
              lVar13 = lVar13 + 1;
            } while (iVar5 != (int)lVar13);
          }
          lVar14 = lVar14 + 1;
        } while (iVar4 != (int)lVar14);
      }
      piVar12 = piVar12 + 1;
      N = N + 1;
      n = n + -1;
      iVar9 = iVar9 + 1;
      iVar5 = iVar5 + -1;
      lVar11 = lVar8;
    } while (iVar7 != local_78);
  }
  return (bool)(-(lu[ps[iVar7]][iVar7] != 0.0) & 1);
}

Assistant:

bool tetgenmesh::lu_decmp(REAL lu[4][4], int n, int* ps, REAL* d, int N)
{
  REAL scales[4];
  REAL pivot, biggest, mult, tempf;
  int pivotindex = 0;
  int i, j, k;

  *d = 1.0;                                      // No row interchanges yet.

  for (i = N; i < n + N; i++) {                             // For each row.
    // Find the largest element in each row for row equilibration
    biggest = 0.0;
    for (j = N; j < n + N; j++)
      if (biggest < (tempf = fabs(lu[i][j])))
        biggest  = tempf;
    if (biggest != 0.0)
      scales[i] = 1.0 / biggest;
    else {
      scales[i] = 0.0;
      return false;                            // Zero row: singular matrix.
    }
    ps[i] = i;                                 // Initialize pivot sequence.
  }

  for (k = N; k < n + N - 1; k++) {                      // For each column.
    // Find the largest element in each column to pivot around.
    biggest = 0.0;
    for (i = k; i < n + N; i++) {
      if (biggest < (tempf = fabs(lu[ps[i]][k]) * scales[ps[i]])) {
        biggest = tempf;
        pivotindex = i;
      }
    }
    if (biggest == 0.0) {
      return false;                         // Zero column: singular matrix.
    }
    if (pivotindex != k) {                         // Update pivot sequence.
      j = ps[k];
      ps[k] = ps[pivotindex];
      ps[pivotindex] = j;
      *d = -(*d);                          // ...and change the parity of d.
    }

    // Pivot, eliminating an extra variable  each time
    pivot = lu[ps[k]][k];
    for (i = k + 1; i < n + N; i++) {
      lu[ps[i]][k] = mult = lu[ps[i]][k] / pivot;
      if (mult != 0.0) {
        for (j = k + 1; j < n + N; j++)
          lu[ps[i]][j] -= mult * lu[ps[k]][j];
      }
    }
  }

  // (lu[ps[n + N - 1]][n + N - 1] == 0.0) ==> A is singular.
  return lu[ps[n + N - 1]][n + N - 1] != 0.0;
}